

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_queue.c
# Opt level: O2

uo_queue * uo_queue_create(size_t capasity)

{
  uo_queue *puVar1;
  void **ppvVar2;
  
  puVar1 = (uo_queue *)calloc(1,0x30);
  sem_init((sem_t *)&puVar1->enqueue_sem,0,(uint)capasity);
  sem_init((sem_t *)&puVar1->dequeue_sem,0,0);
  puVar1->head = 0;
  puVar1->tail = 0;
  puVar1->capasity = capasity;
  ppvVar2 = (void **)malloc(capasity << 3);
  puVar1->items = ppvVar2;
  return puVar1;
}

Assistant:

uo_queue *uo_queue_create(
    size_t capasity)
{
    uo_queue *queue = calloc(1, sizeof *queue);

    sem_init((sem_t *)&queue->enqueue_sem, 0, capasity);
    sem_init((sem_t *)&queue->dequeue_sem, 0, 0);

    atomic_init(&queue->head, 0);
    atomic_init(&queue->tail, 0);

    queue->capasity = capasity;
    queue->items = malloc(sizeof *queue->items * capasity);

    return queue;
}